

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

int shallow_dump(nvamemtiming_conf *conf)

{
  uint8_t uVar1;
  ushort uVar2;
  value_type vVar3;
  byte bVar4;
  int iVar5;
  FILE *__stream;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  char filename [21];
  
  builtin_strncpy(filename,"regs_timing",0xc);
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open regs_timing");
    iVar5 = 1;
  }
  else {
    timing_value_types = nv40_timing_value_types;
    if (0xbf < nva_cards[conf->cnum].card_type) {
      timing_value_types = nvc0_timing_value_types;
    }
    bVar4 = (conf->field_4).manual.index;
    if (bVar4 == 0xff) {
      (conf->field_4).manual.index = '\0';
      bVar4 = 0;
    }
    if ((conf->field_4).manual.value == 0xff) {
      (conf->field_4).manual.value = (uint8_t)(conf->vbios).timing_entry_length;
    }
    fprintf(_stderr,"Shallow mode: Will iterate between %i and %i\n",(ulong)bVar4);
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    for (uVar8 = (ulong)(conf->field_4).manual.index; uVar8 < (conf->field_4).manual.value;
        uVar8 = uVar8 + 1) {
      puVar6 = (conf->vbios).data;
      uVar2 = (conf->vbios).timing_entry_offset;
      uVar7 = (ulong)uVar2;
      uVar1 = puVar6[uVar8 + uVar7];
      vVar3 = timing_value_types[uVar8];
      if (vVar3 == VALUE) {
LAB_00103591:
        puVar6[uVar7 + uVar8] = puVar6[uVar7 + uVar8] + '\x01';
        launch(conf,(FILE *)__stream,(uint8_t)uVar8 + '\x01',COLOR);
      }
      else {
        if ((vVar3 == EMPTY) && (uVar1 != '\0')) {
          fwrite("WARNING: The following entry was supposed to be unused!\n",0x38,1,__stream);
          puVar6 = (conf->vbios).data;
          uVar7 = (ulong)(conf->vbios).timing_entry_offset;
          goto LAB_00103591;
        }
        if (vVar3 == BITFIELD) {
          iterate_bitfield(conf,(FILE *)__stream,(uint8_t)uVar8,(uint)uVar2);
        }
        else if (vVar3 == EMPTY) {
          fprintf(__stream,"timing entry [%u/%u] is supposed empty\n\n",(ulong)((int)uVar8 + 1),
                  (ulong)(conf->vbios).timing_entry_length);
        }
      }
      (conf->vbios).data[uVar8 + (conf->vbios).timing_entry_offset] = uVar1;
    }
    fclose(__stream);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
shallow_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == -1 ||  conf->range.end == -1)
		sprintf(filename, "regs_timing_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing");
		return 1;
	}

	if (nva_cards[conf->cnum].card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length;

	fprintf(stderr, "Shallow mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = conf->range.start; i < conf->range.end; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			conf->vbios.data[conf->vbios.timing_entry_offset + i]++;
			launch(conf, outf, i + 1, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}